

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool c4::yml::anon_unknown_0::_is_doc_sep(csubstr s)

{
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr chars_00;
  bool bVar1;
  int iVar2;
  error_flags eVar3;
  ulong in_RSI;
  csubstr whitesp;
  csubstr ellipsis;
  csubstr dashes;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffe47;
  basic_substring<const_char> *in_stack_fffffffffffffe48;
  char *s_;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  size_t in_stack_fffffffffffffe58;
  basic_substring<const_char> local_198;
  char *local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  basic_substring<const_char> *in_stack_fffffffffffffea8;
  char local_f8 [8];
  ulong local_f0;
  bool local_e1;
  char *local_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  char *local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  char *local_98;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  char *local_28;
  undefined8 local_20;
  char *local_18;
  char *local_10;
  undefined8 local_8;
  
  pattern.str._7_1_ = in_stack_fffffffffffffe57;
  pattern.str._0_7_ = in_stack_fffffffffffffe50;
  pattern.len = in_stack_fffffffffffffe58;
  local_f0 = in_RSI;
  bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe48,pattern);
  if (bVar1) {
    local_40 = "---";
    local_38 = 3;
    local_48 = local_f8;
    local_58 = "---";
    local_50 = 3;
    local_28 = "---";
    local_20 = 3;
    local_30 = local_48;
    iVar2 = basic_substring<const_char>::compare
                      (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                      );
    uVar4 = true;
    local_e1 = (bool)uVar4;
    if (iVar2 != 0) {
      s_ = local_f8;
      local_a0 = 3;
      local_98 = s_;
      if (local_f0 < 3) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) &&
           (in_stack_fffffffffffffe47 = is_debugger_attached(), (bool)in_stack_fffffffffffffe47)) {
          trap_instruction();
        }
        local_b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_a8 = 0x1533;
        handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)CONCAT17(uVar4,in_stack_fffffffffffffe50),s_,
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      chars_00.len = 2;
      chars_00.str = " \t";
      local_e1 = basic_substring<const_char>::begins_with_any
                           ((basic_substring<const_char> *)&stack0xfffffffffffffea8,chars_00);
    }
  }
  else {
    local_178 = "...";
    local_170 = 3;
    pattern_00.str._7_1_ = in_stack_fffffffffffffe57;
    pattern_00.str._0_7_ = in_stack_fffffffffffffe50;
    pattern_00.len = in_stack_fffffffffffffe58;
    bVar1 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe48,pattern_00);
    if (bVar1) {
      local_188 = "...";
      local_180 = 3;
      local_68 = "...";
      local_60 = 3;
      local_70 = local_f8;
      local_80 = "...";
      local_78 = 3;
      local_10 = "...";
      local_8 = 3;
      local_18 = local_70;
      iVar2 = basic_substring<const_char>::compare
                        (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98);
      uVar4 = true;
      local_e1 = (bool)uVar4;
      if (iVar2 != 0) {
        local_c8 = local_f8;
        local_d0 = 3;
        if (local_f0 < 3) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x1533;
          handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (char *)in_stack_fffffffffffffe48,
                   CONCAT17(in_stack_fffffffffffffe47,CONCAT16(uVar4,in_stack_fffffffffffffe40)));
        local_198.str = local_c0;
        local_198.len = local_b8;
        chars.len = 2;
        chars.str = " \t";
        local_e1 = basic_substring<const_char>::begins_with_any(&local_198,chars);
      }
    }
    else {
      local_e1 = false;
    }
  }
  return local_e1;
}

Assistant:

bool _is_doc_sep(csubstr s)
{
    constexpr const csubstr dashes = "---";
    constexpr const csubstr ellipsis = "...";
    constexpr const csubstr whitesp = " \t";
    if(s.begins_with(dashes))
        return s == dashes || s.sub(3).begins_with_any(whitesp);
    else if(s.begins_with(ellipsis))
        return s == ellipsis || s.sub(3).begins_with_any(whitesp);
    return false;
}